

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O0

void mread(memfile *mf,void *buf,uint len)

{
  uint local_24;
  int rlen;
  uint len_local;
  void *buf_local;
  memfile *mf_local;
  
  local_24 = len;
  if ((uint)(mf->len - mf->pos) <= len) {
    local_24 = mf->len - mf->pos;
  }
  memcpy(buf,mf->buf + mf->pos,(long)(int)local_24);
  mf->pos = local_24 + mf->pos;
  if (local_24 == len) {
    return;
  }
  panic("Error reading game data.");
}

Assistant:

void mread(struct memfile *mf, void *buf, unsigned int len)
{
	int rlen = min(len, mf->len - mf->pos);

	memcpy(buf, &mf->buf[mf->pos], rlen);
	mf->pos += rlen;
	if ((unsigned)rlen != len)
	    panic("Error reading game data.");
}